

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O1

bool __thiscall cmRST::ProcessInclude(cmRST *this,string *file,IncludeType type)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  _Alloc_hider _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cmRST r;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_bf0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  cmRST local_bb0;
  
  if (9 < this->IncludeDepth) {
    return false;
  }
  cmRST(&local_bb0,this->OS,&this->DocRoot);
  local_bb0.IncludeDepth = this->IncludeDepth + 1;
  local_bb0.OutputLinePending = this->OutputLinePending;
  if (type != IncludeTocTree) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&local_bb0.Replace._M_t,&(this->Replace)._M_t);
  }
  if (*(file->_M_dataplus)._M_p == '/') {
    std::operator+(&local_bd0,&this->DocRoot,file);
    std::__cxx11::string::operator=((string *)file,(string *)&local_bd0);
    local_be0._M_allocated_capacity = local_bd0.field_2._M_allocated_capacity;
    _Var5._M_p = local_bd0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd0._M_dataplus._M_p == &local_bd0.field_2) goto LAB_0037eaf7;
  }
  else {
    pcVar1 = (this->DocDir)._M_dataplus._M_p;
    local_bf0[0] = &local_be0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_bf0,pcVar1,pcVar1 + (this->DocDir)._M_string_length);
    std::__cxx11::string::append((char *)local_bf0);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_bf0,(ulong)(file->_M_dataplus)._M_p);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_bd0.field_2._M_allocated_capacity = *psVar4;
      local_bd0.field_2._8_8_ = plVar3[3];
      local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
    }
    else {
      local_bd0.field_2._M_allocated_capacity = *psVar4;
      local_bd0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_bd0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)file,(string *)&local_bd0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
      operator_delete(local_bd0._M_dataplus._M_p,local_bd0.field_2._M_allocated_capacity + 1);
    }
    _Var5._M_p = (pointer)local_bf0[0];
    if (local_bf0[0] == &local_be0) goto LAB_0037eaf7;
  }
  operator_delete(_Var5._M_p,local_be0._M_allocated_capacity + 1);
LAB_0037eaf7:
  bVar2 = ProcessFile(&local_bb0,file,type == IncludeModule);
  if (type != IncludeTocTree) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&(this->Replace)._M_t,&local_bb0.Replace._M_t);
  }
  this->OutputLinePending = local_bb0.OutputLinePending;
  ~cmRST(&local_bb0);
  return bVar2;
}

Assistant:

bool cmRST::ProcessInclude(std::string file, IncludeType type)
{
  bool found = false;
  if (this->IncludeDepth < 10) {
    cmRST r(this->OS, this->DocRoot);
    r.IncludeDepth = this->IncludeDepth + 1;
    r.OutputLinePending = this->OutputLinePending;
    if (type != IncludeTocTree) {
      r.Replace = this->Replace;
    }
    if (file[0] == '/') {
      file = this->DocRoot + file;
    } else {
      file = this->DocDir + "/" + file;
    }
    found = r.ProcessFile(file, type == IncludeModule);
    if (type != IncludeTocTree) {
      this->Replace = r.Replace;
    }
    this->OutputLinePending = r.OutputLinePending;
  }
  return found;
}